

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O2

S2CellId __thiscall S2CellId::parent(S2CellId *this,int level)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  S2LogMessage local_20;
  
  uVar1 = this->id_;
  if (((uint)(uVar1 >> 0x3e) < 3) && ((uVar1 & 0x1555555555555555 & -uVar1) != 0)) {
    if (level < 0) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x263,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_20.stream_,"Check failed: (level) >= (0) ");
    }
    else {
      iVar2 = S2CellId::level(this);
      if (level <= iVar2) {
        bVar3 = (char)level * -2 + 0x3c;
        return (S2CellId)(-(1L << (bVar3 & 0x3f)) & this->id_ | 1L << ((ulong)bVar3 & 0x3f));
      }
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x264,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_20.stream_,"Check failed: (level) <= (this->level()) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x262,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_20.stream_,"Check failed: is_valid() ");
  }
  abort();
}

Assistant:

inline int S2CellId::face() const {
  return id_ >> kPosBits;
}